

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::getPartialStates(Synth *this,Bit8u *partialStates)

{
  PartialState PVar1;
  Bit8u packedStates;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint quartNum;
  uint uVar5;
  uint partialNum;
  
  if (this->opened == true) {
    uVar4 = 0;
    for (uVar5 = 0; uVar5 * 4 < this->partialCount; uVar5 = uVar5 + 1) {
      iVar3 = 0;
      bVar2 = 0;
      for (partialNum = uVar4; (iVar3 != 8 && (partialNum < this->partialCount));
          partialNum = partialNum + 1) {
        PVar1 = getPartialState(this->partialManager,partialNum);
        bVar2 = bVar2 | (byte)((PVar1 & PartialState_RELEASE) << ((byte)iVar3 & 0x1f));
        iVar3 = iVar3 + 2;
      }
      partialStates[uVar5] = bVar2;
      uVar4 = uVar4 + 4;
    }
    return;
  }
  memset(partialStates,0,(ulong)(this->partialCount + 3 >> 2));
  return;
}

Assistant:

void Synth::getPartialStates(Bit8u *partialStates) const {
	if (!opened) {
		memset(partialStates, 0, ((partialCount + 3) >> 2));
		return;
	}
	for (unsigned int quartNum = 0; (4 * quartNum) < partialCount; quartNum++) {
		Bit8u packedStates = 0;
		for (unsigned int i = 0; i < 4; i++) {
			unsigned int partialNum = (4 * quartNum) + i;
			if (partialCount <= partialNum) break;
			PartialState partialState = getPartialState(partialManager, partialNum);
			packedStates |= (partialState & 3) << (2 * i);
		}
		partialStates[quartNum] = packedStates;
	}
}